

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_1::WatWriter::WriteBeginFunc(WatWriter *this,Func *func)

{
  Module *this_00;
  bool bVar1;
  NextChar in_R8D;
  string_view str;
  Location LStack_98;
  Var local_70;
  
  WritePuts(this,"(",None);
  WritePuts(this,"func",Space);
  this->indent_ = this->indent_ + 2;
  str._M_str = (func->name)._M_dataplus._M_p;
  str._M_len = (func->name)._M_string_length;
  WriteNameOrIndex(this,str,this->func_index_,in_R8D);
  WriteInlineExports(this,First,this->func_index_);
  WriteInlineImport(this,First,this->func_index_);
  if ((func->decl).has_func_type == true) {
    WritePuts(this,"(",None);
    WritePuts(this,"type",Space);
    this->indent_ = this->indent_ + 2;
    WriteVar(this,&(func->decl).type_var,None);
    WriteClose(this,Space);
  }
  this_00 = (this->super_ModuleContext).module;
  LStack_98.field_1.field_0.line = 0;
  LStack_98.field_1._4_8_ = 0;
  LStack_98.filename._M_len = 0;
  LStack_98.filename._M_str._0_4_ = 0;
  LStack_98.filename._M_str._4_4_ = 0;
  Var::Var(&local_70,this->func_index_,&LStack_98);
  bVar1 = Module::IsImport(this_00,First,&local_70);
  Var::~Var(&local_70);
  if ((bVar1) && ((this->options_->inline_import != false || ((func->decl).has_func_type == false)))
     ) {
    WriteTypes(this,&(func->decl).sig.param_types,"param");
    WriteTypes(this,&(func->decl).sig.result_types,"result");
  }
  this->func_index_ = this->func_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteBeginFunc(const Func& func) {
  WriteOpenSpace("func");
  WriteNameOrIndex(func.name, func_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Func, func_index_);
  WriteInlineImport(ExternalKind::Func, func_index_);
  if (func.decl.has_func_type) {
    WriteOpenSpace("type");
    WriteVar(func.decl.type_var, NextChar::None);
    WriteCloseSpace();
  }

  if (module.IsImport(ExternalKind::Func, Var(func_index_, Location()))) {
    // Imported functions can be written a few ways:
    //
    //   1. (import "module" "field" (func (type 0)))
    //   2. (import "module" "field" (func (param i32) (result i32)))
    //   3. (func (import "module" "field") (type 0))
    //   4. (func (import "module" "field") (param i32) (result i32))
    //   5. (func (import "module" "field") (type 0) (param i32) (result i32))
    //
    // Note that the text format does not allow including the param/result
    // explicitly when using the "(import..." syntax (#1 and #2).
    if (options_.inline_import || !func.decl.has_func_type) {
      WriteFuncSigSpace(func.decl.sig);
    }
  }
  func_index_++;
}